

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

EntryType * __thiscall
JsUtil::
BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::AllocateEntries(BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *this,int size,bool zeroAllocate)

{
  SimpleDictionaryEntry<StackSym_*,_StackLiteralInitFldData> *pSVar1;
  undefined7 in_register_00000011;
  code *allocator;
  
  if ((int)CONCAT71(in_register_00000011,zeroAllocate) == 0) {
    allocator = Memory::JitArenaAllocator::Alloc;
  }
  else {
    allocator = Memory::JitArenaAllocator::AllocZero;
  }
  pSVar1 = Memory::
           AllocateArray<Memory::JitArenaAllocator,JsUtil::SimpleDictionaryEntry<StackSym*,StackLiteralInitFldData>,false>
                     ((Memory *)this->alloc,(JitArenaAllocator *)allocator,0,(long)size);
  return pSVar1;
}

Assistant:

EntryType * AllocateEntries(DECLSPEC_GUARD_OVERFLOW int size, const bool zeroAllocate = true)
        {
            // Note that the choice of leaf/non-leaf node is decided for the EntryType on the basis of TValue. By default, if
            // TValue is a pointer, a non-leaf allocation is done. This behavior can be overridden by specializing
            // TypeAllocatorFunc for TValue.
            return
                AllocateArray<AllocatorType, EntryType, false>(
                    TRACK_ALLOC_INFO(alloc, EntryType, AllocatorType, 0, size),
                    zeroAllocate ? EntryAllocatorFuncType::GetAllocZeroFunc() : EntryAllocatorFuncType::GetAllocFunc(),
                    size);
        }